

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O2

int generate_C_code(Ravi_CompilerInterface *ravi_interface,Proc *proc,TextBuffer *mb)

{
  TextBuffer *pTVar1;
  uint uVar2;
  BasicBlock *pBVar3;
  int iVar4;
  Instruction *insn;
  Proc *proc_00;
  int i;
  long lVar5;
  Function fn;
  PtrListIterator insniter__;
  
  pTVar1 = &fn.prologue;
  fn.proc = proc;
  fn.api = ravi_interface;
  snprintf(proc->funcname,0x1e,"__ravifunc_%d",(ulong)proc->id);
  raviX_buffer_init(pTVar1,0x1000);
  raviX_buffer_init(&fn.body,0x1000);
  raviX_buffer_init(&fn.tb,0x100);
  raviX_buffer_init(&fn.C_local_declarations,0x100);
  raviX_buffer_add_fstring(pTVar1,"static int %s(lua_State *L) {\n",proc->funcname);
  raviX_buffer_add_string(pTVar1,"int raviX__error_code = 0;\n");
  raviX_buffer_add_string(pTVar1,"int result = 0;\n");
  raviX_buffer_add_string(pTVar1,"CallInfo *ci = L->ci;\n");
  raviX_buffer_add_string(pTVar1,"LClosure *cl = clLvalue(ci->func);\n");
  raviX_buffer_add_string(pTVar1,"TValue *k = cl->p->k;\n");
  raviX_buffer_add_string(pTVar1,"StkId base = ci->u.l.base;\n");
  emit_vars("lua_Integer","raviX__i_",&proc->temp_int_pseudos,pTVar1);
  emit_vars("lua_Number","raviX__f_",&proc->temp_flt_pseudos,pTVar1);
  emit_vars("lua_Integer","raviX__i_",&proc->temp_int_pseudos,&fn.C_local_declarations);
  emit_vars("lua_Number","raviX__f_",&proc->temp_flt_pseudos,&fn.C_local_declarations);
  raviX_buffer_add_string(pTVar1,"TValue ival0; settt_(&ival0, LUA_TNUMINT);\n");
  raviX_buffer_add_string(pTVar1,"TValue fval0; settt_(&fval0, LUA_TNUMFLT);\n");
  raviX_buffer_add_string(pTVar1,"TValue bval0; settt_(&bval0, LUA_TBOOLEAN);\n");
  raviX_buffer_add_string(pTVar1,"TValue ival1; settt_(&ival1, LUA_TNUMINT);\n");
  raviX_buffer_add_string(pTVar1,"TValue fval1; settt_(&fval1, LUA_TNUMFLT);\n");
  raviX_buffer_add_string(pTVar1,"TValue bval1; settt_(&bval1, LUA_TBOOLEAN);\n");
  raviX_buffer_add_string(pTVar1,"TValue ival2; settt_(&ival2, LUA_TNUMINT);\n");
  raviX_buffer_add_string(pTVar1,"TValue fval2; settt_(&fval2, LUA_TNUMFLT);\n");
  raviX_buffer_add_string(pTVar1,"TValue bval2; settt_(&bval2, LUA_TBOOLEAN);\n");
  raviX_buffer_add_string(pTVar1,"TValue nilval; setnilvalue(&nilval);\n");
  iVar4 = _setjmp((__jmp_buf_tag *)fn.env);
  if (iVar4 == 0) {
    for (lVar5 = 0; lVar5 < (int)proc->node_count; lVar5 = lVar5 + 1) {
      pBVar3 = proc->nodes[lVar5];
      uVar2 = pBVar3->index;
      if (uVar2 < 2) {
LAB_0011a938:
        raviX_buffer_add_fstring(&fn.body,"L%d:\n",(ulong)uVar2);
        raviX_ptrlist_forward_iterator(&insniter__,(PtrList *)pBVar3->insns);
        do {
          insn = (Instruction *)raviX_ptrlist_iter_next(&insniter__);
          if (insn == (Instruction *)0x0) {
            iVar4 = 0;
            break;
          }
          iVar4 = output_instruction(&fn,insn);
        } while (iVar4 == 0);
        if (pBVar3->index == 1) {
          pTVar1 = &fn.body;
          raviX_buffer_add_string(pTVar1," return result;\n");
          raviX_buffer_add_string(pTVar1,"Lraise_error:\n");
          raviX_buffer_add_string
                    (pTVar1," raviV_raise_error(L, raviX__error_code); /* does not return */\n");
          raviX_buffer_add_string(pTVar1," return result;\n");
        }
        if (iVar4 != 0) goto LAB_0011a9db;
      }
      else {
        iVar4 = raviX_ptrlist_size((PtrList *)pBVar3->insns);
        if (iVar4 != 0) {
          uVar2 = pBVar3->index;
          goto LAB_0011a938;
        }
      }
    }
    iVar4 = 0;
LAB_0011a9db:
    raviX_buffer_add_string(&fn.body,"}\n");
    raviX_buffer_add_string(mb,fn.prologue.buf);
    raviX_buffer_add_string(mb,fn.body.buf);
  }
  raviX_buffer_free(&fn.prologue);
  raviX_buffer_free(&fn.body);
  raviX_buffer_free(&fn.tb);
  raviX_buffer_free(&fn.C_local_declarations);
  if (iVar4 == 0) {
    raviX_ptrlist_forward_iterator((PtrListIterator *)&fn,(PtrList *)proc->procs);
    do {
      proc_00 = (Proc *)raviX_ptrlist_iter_next((PtrListIterator *)&fn);
      if (proc_00 == (Proc *)0x0) {
        return 0;
      }
      iVar4 = generate_C_code(ravi_interface,proc_00,mb);
    } while (iVar4 == 0);
  }
  return iVar4;
}

Assistant:

static int generate_C_code(struct Ravi_CompilerInterface *ravi_interface, Proc *proc, TextBuffer *mb)
{
	int rc = 0;
	{
		Function fn;
		initfn(&fn, proc, ravi_interface);
		rc = setjmp(fn.env);
		if (rc == 0) {
			BasicBlock *bb;
			for (int i = 0; i < (int)proc->node_count; i++) {
				bb = proc->nodes[i];
				rc = output_basic_block(&fn, bb);
				if (rc != 0)
					break;
			}

			raviX_buffer_add_string(&fn.body, "}\n");
			raviX_buffer_add_string(mb, fn.prologue.buf);
			raviX_buffer_add_string(mb, fn.body.buf);
		}
		cleanup(&fn);
	}
	if (rc != 0)
		return rc;

	Proc *childproc;
	FOR_EACH_PTR(proc->procs, Proc, childproc)
	{
		rc = generate_C_code(ravi_interface, childproc, mb);
		if (rc != 0)
			return rc;
	}
	END_FOR_EACH_PTR(childproc)
	return 0;
}